

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

void __thiscall cmXMLParser::EndElement(cmXMLParser *this,string *name)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"End element: ");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void cmXMLParser::EndElement(const std::string& name)
{
  std::cout << "End element: " << name << std::endl;
}